

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<Assimp::FIDoubleValue> __thiscall
Assimp::FIDoubleValue::create(FIDoubleValue *this,vector<double,_std::allocator<double>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIDoubleValue> sVar1;
  vector<double,_std::allocator<double>_> local_28;
  vector<double,_std::allocator<double>_> *value_local;
  
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)value;
  value_local = (vector<double,_std::allocator<double>_> *)this;
  std::make_shared<Assimp::FIDoubleValueImpl,std::vector<double,std::allocator<double>>>(&local_28);
  std::shared_ptr<Assimp::FIDoubleValue>::shared_ptr<Assimp::FIDoubleValueImpl,void>
            ((shared_ptr<Assimp::FIDoubleValue> *)this,
             (shared_ptr<Assimp::FIDoubleValueImpl> *)&local_28);
  std::shared_ptr<Assimp::FIDoubleValueImpl>::~shared_ptr
            ((shared_ptr<Assimp::FIDoubleValueImpl> *)&local_28);
  sVar1.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIDoubleValue>)
         sVar1.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIDoubleValue> FIDoubleValue::create(std::vector<double> &&value) {
    return std::make_shared<FIDoubleValueImpl>(std::move(value));
}